

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O1

pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<MiniSTOptions>::insert_simplex_and_subfaces<short[4]>
          (Simplex_tree<MiniSTOptions> *this,short (*Nsimplex) [4],Filtration_value *filtration)

{
  long lVar1;
  Filtration_value *filt;
  long lVar2;
  int iVar3;
  ulong uVar4;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> _Var5;
  long lVar6;
  undefined8 *puVar7;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> _Var8;
  long *in_FS_OFFSET;
  pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_bool>
  pVar9;
  
  if ((char)in_FS_OFFSET[-0x19] == '\0') {
    insert_simplex_and_subfaces<short[4]>();
  }
  if (in_FS_OFFSET[-0x1b] != in_FS_OFFSET[-0x1c]) {
    in_FS_OFFSET[-0x1b] = in_FS_OFFSET[-0x1c];
  }
  std::vector<short,std::allocator<short>>::_M_range_insert<short_const*>
            ((vector<short,std::allocator<short>> *)(*in_FS_OFFSET + -0xe0),in_FS_OFFSET[-0x1b],
             filtration,filtration + 1);
  lVar6 = in_FS_OFFSET[-0x1c];
  lVar1 = in_FS_OFFSET[-0x1b];
  if (lVar6 != lVar1) {
    uVar4 = lVar1 - lVar6 >> 1;
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (lVar6,lVar1,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (lVar6,lVar1);
  }
  _Var5 = std::
          __unique<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    (in_FS_OFFSET[-0x1c],in_FS_OFFSET[-0x1b]);
  if ((_Var5._M_current != (short *)in_FS_OFFSET[-0x1b]) &&
     (lVar6 = (long)_Var5._M_current + (in_FS_OFFSET[-0x1b] - in_FS_OFFSET[-0x1b]),
     in_FS_OFFSET[-0x1b] != lVar6)) {
    in_FS_OFFSET[-0x1b] = lVar6;
  }
  _Var5._M_current = (short *)in_FS_OFFSET[-0x1c];
  filt = (Filtration_value *)in_FS_OFFSET[-0x1b];
  if ((Filtration_value *)_Var5._M_current != filt) {
    _Var8._M_current = _Var5._M_current;
    do {
      if (*_Var8._M_current == Nsimplex[7][0]) {
        puVar7 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar7 = "cannot use the dummy null_vertex() as a real vertex";
        __cxa_throw(puVar7,&char_const*::typeinfo,0);
      }
      _Var8._M_current = _Var8._M_current + 2;
    } while ((Filtration_value *)_Var8._M_current != filt);
  }
  iVar3 = (int)((ulong)((long)filt - (long)_Var5._M_current) >> 1) + -1;
  if (iVar3 < *(int *)Nsimplex[0x10]) {
    iVar3 = *(int *)Nsimplex[0x10];
  }
  *(int *)Nsimplex[0x10] = iVar3;
  pVar9 = rec_insert_simplex_and_subfaces_sorted<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>>
                    (this,(Siblings *)Nsimplex,
                     (__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>)
                     (Nsimplex + 8),_Var5,filt);
  pVar9.first.m_ptr =
       (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>
        *)this;
  return pVar9;
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex_and_subfaces(
      const InputVertexRange& Nsimplex,
      const Filtration_value& filtration = Filtration_value())
  {
    auto first = std::begin(Nsimplex);
    auto last = std::end(Nsimplex);

    if (first == last)
      return { null_simplex(), true }; // FIXME: false would make more sense to me.

    thread_local std::vector<Vertex_handle> copy;
    copy.clear();
    copy.insert(copy.end(), first, last);
    std::sort(copy.begin(), copy.end());
    auto last_unique = std::unique(copy.begin(), copy.end());
    copy.erase(last_unique, copy.end());
    GUDHI_CHECK_code(
      for (Vertex_handle v : copy)
        GUDHI_CHECK(v != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
    )
    // Update dimension if needed. We could wait to see if the insertion succeeds, but I doubt there is much to gain.
    dimension_ = (std::max)(dimension_, static_cast<int>(std::distance(copy.begin(), copy.end())) - 1);

    return rec_insert_simplex_and_subfaces_sorted(root(), copy.begin(), copy.end(), filtration);
  }